

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

int snprintf_long_canframe(char *buf,size_t size,cu_t *cu,int view)

{
  __u8 _Var1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  char cVar9;
  canid_t id;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  byte *pbVar14;
  long lVar15;
  char *pcVar16;
  uint uVar17;
  uint uVar18;
  
  if (size == 0) {
    size = 0;
    goto LAB_0010404d;
  }
  bVar11 = (cu->fd).len;
  if ((char)bVar11 < '\0') {
    uVar2 = (cu->xl).len;
    uVar8 = 0x40;
    if (uVar2 < 0x40) {
      uVar8 = (ulong)(uint)uVar2;
    }
    if ((uVar8 * 3 + 0x29 & 0xffff) <= size - 1) {
      if ((view & 0x10U) == 0) {
        uVar12 = 3;
        uVar18 = (cu->cc).can_id;
        pcVar16 = buf;
      }
      else {
        uVar12 = 8;
        builtin_strncpy(buf,"     ",5);
        pcVar16 = buf + 5;
        uVar18 = (cu->cc).can_id;
      }
      _put_id(pcVar16,2,uVar18 & 0x7ff);
      uVar4 = 0;
      iVar13 = sprintf(buf + uVar12," [%04d] (%02X|%02X:%02X:%08X) ",(ulong)(uint)uVar2,
                       (ulong)(byte)cu->field3[2],(ulong)(cu->fd).len,(ulong)(cu->cc).__pad,
                       (cu->xl).af);
      size = (size_t)(iVar13 + uVar12);
      while( true ) {
        iVar13 = (int)size;
        lVar5 = (long)iVar13;
        if (uVar8 == uVar4) break;
        bVar11 = cu->field3[uVar4 + 0xc];
        buf[lVar5] = "0123456789ABCDEF"[bVar11 >> 4];
        buf[lVar5 + 1] = "0123456789ABCDEF"[bVar11 & 0xf];
        uVar10 = lVar5 + 2;
        uVar4 = uVar4 + 1;
        if (uVar4 < uVar8) {
          buf[uVar10] = ' ';
          uVar10 = (ulong)(iVar13 + 3);
        }
        size = uVar10 & 0xffffffff;
      }
      if ((ushort)uVar8 < (cu->xl).len) {
        builtin_strncpy(buf + lVar5," ...",5);
        size = (size_t)(iVar13 + 4);
      }
      buf[(int)size] = '\0';
      goto LAB_0010404d;
    }
  }
  else {
    _Var1 = (cu->cc).__pad;
    uVar18 = 0x40;
    if (bVar11 < 0x40) {
      uVar18 = (uint)bVar11;
    }
    uVar12 = (uint)bVar11;
    if (7 < bVar11) {
      uVar12 = 8;
    }
    uVar17 = uVar18;
    if (_Var1 == '\0') {
      uVar17 = uVar12;
    }
    iVar13 = 9;
    if ((view & 2U) == 0) {
      iVar13 = 3;
    }
    if (((cu->cc).can_id >> 0x1e & 1) == 0) {
      uVar8 = (ulong)(iVar13 * uVar17) + 0x11;
      if (((byte)uVar17 < 9) && ((((cu->cc).can_id >> 0x1d & 1) != 0 || ((view & 1U) != 0)))) {
        uVar8 = (ulong)((8 - uVar17) * iVar13) + (ulong)(iVar13 * uVar17) + 0x20;
      }
    }
    else {
      uVar8 = 0x24;
    }
    if (uVar8 <= size - 1) {
      builtin_strncpy(buf,"               ",0xf);
      uVar3 = (cu->cc).can_id;
      lVar5 = 10;
      if ((uVar3 >> 0x1d & 1) == 0) {
        if ((int)uVar3 < 0) {
          id = uVar3 & 0x1fffffff;
          goto LAB_00103cbf;
        }
        if ((view & 0x10U) != 0) {
          id = uVar3 & 0x7ff;
          iVar6 = 2;
          pcVar16 = buf + 5;
          goto LAB_00103cc5;
        }
        _put_id(buf,2,uVar3 & 0x7ff);
        lVar5 = 5;
      }
      else {
        id = uVar3 & 0x3fffffff;
LAB_00103cbf:
        iVar6 = 7;
        pcVar16 = buf;
LAB_00103cc5:
        _put_id(pcVar16,iVar6,id);
      }
      iVar6 = (int)lVar5;
      if (_Var1 == '\0') {
        if ((view & 0x20U) == 0) {
          buf[lVar5 + 1] = '[';
          bVar11 = (byte)uVar12 | 0x30;
          cVar9 = ']';
        }
        else {
          uVar18 = (uint)(cu->cc).len8_dlc;
          if (6 < (byte)((cu->cc).len8_dlc - 9)) {
            uVar18 = uVar12;
          }
          if (bVar11 < 8) {
            uVar18 = uVar12;
          }
          buf[lVar5 + 1] = '{';
          bVar11 = "0123456789ABCDEF"[uVar18];
          cVar9 = '}';
        }
        buf[lVar5 + 2] = bVar11;
        buf[lVar5 + 3] = cVar9;
        if ((cu->field3[3] & 0x40) != 0) {
          builtin_strncpy(buf + lVar5 + 5," remote request",0x10);
          size = (size_t)(iVar6 + 0x14);
          goto LAB_0010404d;
        }
      }
      else {
        buf[lVar5] = '[';
        buf[lVar5 + 1] = (byte)((ushort)uVar18 / 10) | 0x30;
        buf[lVar5 + 2] = (byte)((ushort)uVar18 % 10) | 0x30;
        buf[lVar5 + 3] = ']';
      }
      uVar8 = (ulong)uVar17;
      if ((view & 2U) == 0) {
        if ((view & 4U) == 0) {
          size = (size_t)(iVar6 + 5);
          for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
            buf[size] = ' ';
            bVar11 = cu->field3[uVar4 + 8];
            buf[size + 1] = "0123456789ABCDEF"[bVar11 >> 4];
            buf[size + 2] = "0123456789ABCDEF"[bVar11 & 0xf];
            size = size + 3;
          }
        }
        else {
          size = (size_t)(iVar6 + 5);
          for (iVar6 = 0; uVar18 = (uVar17 - 1) + iVar6, -1 < (int)uVar18; iVar6 = iVar6 + -1) {
            buf[size] = (iVar6 != 0) << 6 | 0x20;
            bVar11 = cu->field3[(ulong)uVar18 + 8];
            buf[size + 1] = "0123456789ABCDEF"[bVar11 >> 4];
            buf[size + 2] = "0123456789ABCDEF"[bVar11 & 0xf];
            size = size + 3;
          }
        }
      }
      else {
        size = (size_t)(iVar6 + 5);
        if ((view & 4U) == 0) {
          for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
            iVar6 = (int)size;
            lVar5 = (long)iVar6;
            buf[lVar5] = ' ';
            pbVar14 = (byte *)(buf + lVar5 + 1);
            for (lVar15 = 0; lVar5 - (iVar6 + 8) != lVar15; lVar15 = lVar15 + -1) {
              *pbVar14 = ((byte)cu->field3[uVar4 + 8] >> ((int)lVar15 + 7U & 0x1f) & 1) == 0 ^ 0x31;
              pbVar14 = pbVar14 + 1;
            }
            size = (size_t)((iVar6 - (int)lVar15) + 1);
          }
        }
        else {
          for (uVar18 = uVar17 - 1; -1 < (int)uVar18; uVar18 = uVar18 - 1) {
            iVar6 = (int)size;
            lVar5 = (long)iVar6;
            buf[lVar5] = (uVar18 != uVar17 - 1) << 6 | 0x20;
            pbVar14 = (byte *)(buf + lVar5 + 1);
            for (lVar15 = 0; lVar5 - (iVar6 + 8) != lVar15; lVar15 = lVar15 + -1) {
              *pbVar14 = ((byte)cu->field3[(ulong)uVar18 + 8] >> ((int)lVar15 + 7U & 0x1f) & 1) == 0
                         ^ 0x31;
              pbVar14 = pbVar14 + 1;
            }
            size = (size_t)((iVar6 - (int)lVar15) + 1);
          }
        }
      }
      iVar6 = (int)size;
      buf[iVar6] = '\0';
      if ((byte)uVar17 < 9) {
        pcVar16 = buf + iVar6;
        if ((cu->field3[3] & 0x20) == 0) {
          if ((view & 1U) != 0) {
            iVar13 = (8 - uVar17) * iVar13;
            iVar7 = iVar6 + iVar13 + 4;
            if ((view & 4U) == 0) {
              sprintf(pcVar16,"%*s",(ulong)(iVar13 + 4),"\'");
              lVar5 = (long)iVar7 << 0x20;
              for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
                cVar9 = cu->field3[uVar4 + 8];
                if (0x5e < (byte)(cVar9 - 0x20U)) {
                  cVar9 = '.';
                }
                buf[uVar4 + (long)iVar7] = cVar9;
                lVar5 = lVar5 + 0x100000000;
              }
              (buf + (lVar5 >> 0x20))[0] = '\'';
              (buf + (lVar5 >> 0x20))[1] = '\0';
              size = (size_t)(iVar6 + iVar13 + (int)uVar4 + 5);
            }
            else {
              sprintf(pcVar16,"%*s",(ulong)(iVar13 + 4),"`");
              uVar18 = iVar6 + iVar13 + 5;
              pcVar16 = buf + iVar7;
              lVar5 = (long)iVar7 << 0x20;
              for (; size = (size_t)uVar18, 0 < (long)uVar8; uVar8 = uVar8 - 1) {
                cVar9 = cu->field3[uVar8 + 7];
                if (0x5e < (byte)(cVar9 - 0x20U)) {
                  cVar9 = '.';
                }
                *pcVar16 = cVar9;
                lVar5 = lVar5 + 0x100000000;
                uVar18 = uVar18 + 1;
                pcVar16 = pcVar16 + 1;
              }
              (buf + (lVar5 >> 0x20))[0] = '`';
              (buf + (lVar5 >> 0x20))[1] = '\0';
            }
          }
        }
        else {
          iVar13 = sprintf(pcVar16,"%*s",(ulong)((8 - uVar17) * iVar13 + 0xd),"ERRORFRAME");
          size = (size_t)(uint)(iVar13 + iVar6);
        }
      }
      goto LAB_0010404d;
    }
  }
  memset(buf,0x2d,size - 1);
  buf[size - 1] = '\0';
LAB_0010404d:
  return (int)size;
}

Assistant:

int snprintf_long_canframe(char *buf, size_t size, cu_t *cu, int view)
{
	/* documentation see lib.h */

	unsigned char is_canfd = cu->fd.flags;
	int i, j, dlen, offset;
	size_t maxsize;
	int len;

	/* ensure space for string termination */
	if (size < 1)
		return size;

	/* handle CAN XL frames */
	if (cu->xl.flags & CANXL_XLF) {
		len = cu->xl.len;

		/* crop to CANFD_MAX_DLEN */
		if (len > CANFD_MAX_DLEN)
			dlen = CANFD_MAX_DLEN;
		else
			dlen = len;

		/* check if the CAN frame fits into the provided buffer */
		if (sizeof(".....123 [2048] (00|11:22:12345678)  ...") + 3 * dlen > size - 1) {
			/* mark buffer overflow in output */
			memset(buf, '-', size - 1);
			buf[size - 1] = 0;
			return size;
		}

		if (view & CANLIB_VIEW_INDENT_SFF) {
			memset(buf, ' ', 5);
			put_sff_id(buf + 5, cu->xl.prio & CANXL_PRIO_MASK);
			offset = 8;
		} else {
			put_sff_id(buf, cu->xl.prio & CANXL_PRIO_MASK);
			offset = 3;
		}

		/* print prio and CAN XL header content */
		offset += sprintf(buf + offset, " [%04d] (%02X|%02X:%02X:%08X) ",
				  len,
				  (canid_t)(cu->xl.prio & CANXL_VCID_MASK) >> CANXL_VCID_OFFSET,
				  cu->xl.flags, cu->xl.sdt, cu->xl.af);

		for (i = 0; i < dlen; i++) {
			put_hex_byte(buf + offset, cu->xl.data[i]);
			offset += 2;
			if (i + 1 < dlen)
				buf[offset++] = ' ';
		}

		/* indicate cropped output */
		if (cu->xl.len > dlen)
			offset += sprintf(buf + offset, " ...");

		buf[offset] = 0;

		return offset;
	}

	/* ensure max length values */
	if (is_canfd)
		len = (cu->fd.len > CANFD_MAX_DLEN) ? CANFD_MAX_DLEN : cu->fd.len;
	else
		len = (cu->fd.len > CAN_MAX_DLEN) ? CAN_MAX_DLEN : cu->fd.len;

	/* check if the CAN frame fits into the provided buffer */
	maxsize = sizeof("12345678  [12]  ");
	if (view & CANLIB_VIEW_BINARY)
		dlen = 9; /* _10101010 */
	else
		dlen = 3; /* _AA */

	if (cu->fd.can_id & CAN_RTR_FLAG) {
		maxsize += sizeof("    remote request");
	} else {
		maxsize += len * dlen;

		if (len <= CAN_MAX_DLEN) {
			if (cu->fd.can_id & CAN_ERR_FLAG) {
				maxsize += sizeof("    ERRORFRAME");
				maxsize += (8 - len) * dlen;
			} else if (view & CANLIB_VIEW_ASCII) {
				maxsize += sizeof("    'a.b.CDEF'");
				maxsize += (8 - len) * dlen;
			}
		}
	}

	if (maxsize > size - 1) {
		/* mark buffer overflow in output */
		memset(buf, '-', size - 1);
		buf[size - 1] = 0;
		return size;
	}

	/* initialize space for CAN-ID and length information */
	memset(buf, ' ', 15);

	if (cu->cc.can_id & CAN_ERR_FLAG) {
		put_eff_id(buf, cu->cc.can_id & (CAN_ERR_MASK | CAN_ERR_FLAG));
		offset = 10;
	} else if (cu->fd.can_id & CAN_EFF_FLAG) {
		put_eff_id(buf, cu->fd.can_id & CAN_EFF_MASK);
		offset = 10;
	} else {
		if (view & CANLIB_VIEW_INDENT_SFF) {
			put_sff_id(buf + 5, cu->fd.can_id & CAN_SFF_MASK);
			offset = 10;
		} else {
			put_sff_id(buf, cu->fd.can_id & CAN_SFF_MASK);
			offset = 5;
		}
	}

	/* The len value is sanitized (see above) */
	if (!is_canfd) {
		if (view & CANLIB_VIEW_LEN8_DLC) {
			unsigned char dlc = cu->cc.len8_dlc;

			/* fall back to len if we don't have a valid DLC > 8 */
			if (!((len == CAN_MAX_DLEN) && (dlc > CAN_MAX_DLEN) &&
			      (dlc <= CAN_MAX_RAW_DLC)))
				dlc = len;

			buf[offset + 1] = '{';
			buf[offset + 2] = hex_asc_upper[dlc];
			buf[offset + 3] = '}';
		} else {
			buf[offset + 1] = '[';
			buf[offset + 2] = len + '0';
			buf[offset + 3] = ']';
		}

		/* standard CAN frames may have RTR enabled */
		if (cu->fd.can_id & CAN_RTR_FLAG) {
			offset += sprintf(buf + offset + 5, " remote request");
			return offset + 5;
		}
	} else {
		buf[offset] = '[';
		buf[offset + 1] = (len / 10) + '0';
		buf[offset + 2] = (len % 10) + '0';
		buf[offset + 3] = ']';
	}
	offset += 5;

	if (view & CANLIB_VIEW_BINARY) {
		/* _10101010 - dlen = 9, see above */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				buf[offset++] = (i == len - 1) ? ' ' : SWAP_DELIMITER;
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1 << j & cu->fd.data[i]) ? '1' : '0';
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1 << j & cu->fd.data[i]) ? '1' : '0';
			}
		}
	} else {
		/* _AA - dlen = 3, see above */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				if (i == len - 1)
					buf[offset++] = ' ';
				else
					buf[offset++] = SWAP_DELIMITER;

				put_hex_byte(buf + offset, cu->fd.data[i]);
				offset += 2;
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				put_hex_byte(buf + offset, cu->fd.data[i]);
				offset += 2;
			}
		}
	}

	buf[offset] = 0; /* terminate string */

	/*
	 * The ASCII & ERRORFRAME output is put at a fixed len behind the data.
	 * For now we support ASCII output only for payload length up to 8 bytes.
	 * Does it make sense to write 64 ASCII byte behind 64 ASCII HEX data on the console?
	 */
	if (len > CAN_MAX_DLEN)
		return offset;

	if (cu->fd.can_id & CAN_ERR_FLAG)
		offset += sprintf(buf + offset, "%*s", dlen * (8 - len) + 13, "ERRORFRAME");
	else if (view & CANLIB_VIEW_ASCII) {
		j = dlen * (8 - len) + 4;
		if (view & CANLIB_VIEW_SWAP) {
			sprintf(buf + offset, "%*s", j, "`");
			offset += j;
			for (i = len - 1; i >= 0; i--)
				if ((cu->fd.data[i] > 0x1F) && (cu->fd.data[i] < 0x7F))
					buf[offset++] = cu->fd.data[i];
				else
					buf[offset++] = '.';

			offset += sprintf(buf + offset, "`");
		} else {
			sprintf(buf + offset, "%*s", j, "'");
			offset += j;
			for (i = 0; i < len; i++)
				if ((cu->fd.data[i] > 0x1F) && (cu->fd.data[i] < 0x7F))
					buf[offset++] = cu->fd.data[i];
				else
					buf[offset++] = '.';

			offset += sprintf(buf + offset, "'");
		}
	}

	return offset;
}